

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

int nhdp_domain_mpr_add(nhdp_domain_mpr *mpr)

{
  list_entity **pplVar1;
  int iVar2;
  list_entity *plVar3;
  int iVar4;
  list_entity *plVar5;
  
  (mpr->_node).key = mpr->name;
  iVar2 = avl_insert(&_domain_mprs,&mpr->_node);
  iVar4 = -1;
  if (iVar2 == 0) {
    plVar3 = _domain_list.prev;
    plVar5 = _domain_list.next;
    if ((_domain_list.next)->prev != _domain_list.prev) {
      do {
        if ((nhdp_domain_mpr *)plVar5[-0x28].prev == &_everyone_mprs) {
          _apply_mpr((nhdp_domain *)(plVar5 + -0x2a),(char *)(plVar5 + -0x29),
                     *(uint8_t *)&plVar5[-0x27].next);
          plVar3 = _domain_list.prev;
        }
        pplVar1 = &plVar5->next;
        plVar5 = *pplVar1;
      } while ((*pplVar1)->prev != plVar3);
    }
    iVar4 = 0;
    if (_flooding_domain.mpr == &_everyone_mprs) {
      _apply_mpr(&_flooding_domain,_flooding_domain.mpr_name,_flooding_domain.local_willingness);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
nhdp_domain_mpr_add(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  /* initialize key */
  mpr->_node.key = mpr->name;

  if (avl_insert(&_domain_mprs, &mpr->_node)) {
    return -1;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == &_everyone_mprs) {
      _apply_mpr(domain, domain->mpr_name, domain->local_willingness);
    }
  }
  if (_flooding_domain.mpr == &_everyone_mprs) {
    _apply_mpr(&_flooding_domain, _flooding_domain.mpr_name, _flooding_domain.local_willingness);
  }
  return 0;
}